

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::
     format<std::__cxx11::string,std::__cxx11::string,char[13],std::__cxx11::string,char[42]>
               (ostream *out,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
               char (*args_2) [13],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
               char (*args_4) [42])

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char (*in_RSI) [42];
  FormatListRef in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  char (*in_R9) [13];
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  args_3_00 = local_90;
  makeFormatList<std::__cxx11::string,std::__cxx11::string,char[13],std::__cxx11::string,char[42]>
            (in_RCX,in_R8,in_R9,args_3_00,in_RSI);
  vformat((ostream *)args_3_00,*in_RSI,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}